

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O2

void ggml_compute_forward_cross_entropy_loss(ggml_compute_params *params,ggml_tensor *dst)

{
  ggml_tensor *pgVar1;
  size_t sVar2;
  long lVar3;
  void *pvVar4;
  float *pfVar5;
  long lVar6;
  char cVar7;
  size_t sVar8;
  char *pcVar9;
  int n;
  undefined8 uVar10;
  int64_t i1;
  long lVar11;
  float *pfVar12;
  undefined1 auVar13 [16];
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  float max;
  float local_80;
  float local_7c;
  ggml_tensor *local_78;
  float local_6c;
  long local_68;
  long local_60;
  ggml_tensor *local_58;
  long local_50;
  float *local_48;
  ggml_compute_params *local_40;
  long local_38;
  undefined1 extraout_var [56];
  
  local_78 = dst->src[0];
  if (local_78->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x21bf,"fatal error");
  }
  pgVar1 = dst->src[1];
  if (pgVar1->type == GGML_TYPE_F32) {
    sVar2 = local_78->nb[0];
    sVar8 = ggml_type_size(0);
    if (sVar2 == sVar8) {
      sVar2 = pgVar1->nb[0];
      sVar8 = ggml_type_size(pgVar1->type);
      if (sVar2 == sVar8) {
        cVar7 = ggml_are_same_shape(local_78,pgVar1);
        if (cVar7 == '\0') {
          pcVar9 = "ggml_are_same_shape(src0, src1)";
          uVar10 = 0x2171;
        }
        else {
          cVar7 = ggml_is_scalar(dst);
          if (cVar7 == '\0') {
            pcVar9 = "ggml_is_scalar(dst)";
            uVar10 = 0x2172;
          }
          else if (dst->type == GGML_TYPE_F32) {
            lVar3 = local_78->ne[0];
            local_58 = dst;
            local_60 = ggml_nrows();
            local_68 = (long)params->nth;
            if ((ulong)((lVar3 * 4 + 4) * local_68) <= params->wsize) {
              local_50 = (long)params->ith;
              local_48 = (float *)params->wdata;
              fVar14 = 0.0;
              pfVar5 = local_48 + local_68 + lVar3 * local_50;
              local_38 = (local_60 + -1 + local_68) / local_68;
              lVar11 = local_38 * local_50;
              local_38 = local_38 + lVar11;
              local_40 = params;
              if (local_60 <= local_38) {
                local_38 = local_60;
              }
              for (; pfVar12 = local_48, lVar6 = local_50, lVar11 < local_38; lVar11 = lVar11 + 1) {
                sVar2 = pgVar1->nb[1];
                n = (int)lVar3;
                pvVar4 = pgVar1->data;
                pfVar12 = (float *)(local_78->nb[1] * lVar11 + (long)local_78->data);
                local_7c = -INFINITY;
                local_6c = fVar14;
                ggml_vec_max_f32(n,&local_7c,pfVar12);
                auVar16._0_8_ = ggml_vec_log_soft_max_f32(n,pfVar5,pfVar12,local_7c);
                auVar16._8_56_ = extraout_var;
                auVar15._0_4_ = (float)auVar16._0_8_;
                auVar15._4_12_ = auVar16._4_12_;
                auVar13._8_4_ = 0x80000000;
                auVar13._0_8_ = 0x8000000080000000;
                auVar13._12_4_ = 0x80000000;
                auVar13 = vxorps_avx512vl(auVar15,auVar13);
                ggml_vec_add1_f32(n,pfVar5,pfVar5,auVar13._0_4_);
                ggml_vec_mul_f32(n,pfVar5,pfVar5,(float *)(sVar2 * lVar11 + (long)pvVar4));
                local_80 = 0.0;
                ggml_vec_sum_f32(n,&local_80,pfVar5);
                fVar14 = local_6c + local_80;
              }
              local_48[local_50] = fVar14;
              ggml_barrier(local_40->threadpool);
              if ((int)lVar6 == 0) {
                pfVar5 = (float *)local_58->data;
                ggml_vec_sum_f32((int)local_68,pfVar5,pfVar12);
                *pfVar5 = (-1.0 / (float)local_60) * *pfVar5;
              }
              return;
            }
            pcVar9 = "params->wsize >= sizeof(float) * (nth + nth * nc)";
            uVar10 = 0x2180;
          }
          else {
            pcVar9 = "dst->type == GGML_TYPE_F32";
            uVar10 = 0x2173;
          }
        }
      }
      else {
        pcVar9 = "src1->nb[0] == ggml_type_size(src1->type)";
        uVar10 = 0x2170;
      }
    }
    else {
      pcVar9 = "src0->nb[0] == ggml_type_size(src0->type)";
      uVar10 = 0x216f;
    }
  }
  else {
    pcVar9 = "src1->type == GGML_TYPE_F32";
    uVar10 = 0x216e;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar10,"GGML_ASSERT(%s) failed",pcVar9);
}

Assistant:

void ggml_compute_forward_cross_entropy_loss(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_cross_entropy_loss_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}